

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O2

int get_tx_type_cost(MACROBLOCK *x,MACROBLOCKD *xd,int plane,TX_SIZE tx_size,TX_TYPE tx_type,
                    int reduced_tx_set_used)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  MB_MODE_INFO *pMVar4;
  byte bVar5;
  int *piVar6;
  int iVar7;
  uint is_inter;
  PREDICTION_MODE *pPVar8;
  
  iVar7 = 0;
  if (plane < 1) {
    pMVar4 = *xd->mi;
    uVar2 = *(ushort *)&pMVar4->field_0xa7;
    if ((char)uVar2 < '\0') {
      is_inter = 1;
    }
    else {
      is_inter = (uint)('\0' < pMVar4->ref_frame[0]);
    }
    bVar1 = ""[tx_size];
    bVar5 = av1_get_ext_tx_set_type(tx_size,is_inter,reduced_tx_set_used);
    iVar7 = 0;
    if ((bVar5 != 0) && (xd->lossless[uVar2 & 7] == 0)) {
      uVar3 = ext_tx_set_index[is_inter][bVar5];
      if (is_inter == 0) {
        if ((int)uVar3 < 1) {
          return 0;
        }
        if ((pMVar4->filter_intra_mode_info).use_filter_intra == '\0') {
          pPVar8 = &pMVar4->mode;
        }
        else {
          pPVar8 = "" + (pMVar4->filter_intra_mode_info).filter_intra_mode;
        }
        piVar6 = (x->mode_costs).intra_tx_type_costs[uVar3][bVar1][*pPVar8] + tx_type;
      }
      else {
        if ((int)uVar3 < 1) {
          return 0;
        }
        piVar6 = (x->mode_costs).inter_tx_type_costs[uVar3][bVar1] + tx_type;
      }
      iVar7 = *piVar6;
    }
  }
  return iVar7;
}

Assistant:

static int get_tx_type_cost(const MACROBLOCK *x, const MACROBLOCKD *xd,
                            int plane, TX_SIZE tx_size, TX_TYPE tx_type,
                            int reduced_tx_set_used) {
  if (plane > 0) return 0;

  const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, reduced_tx_set_used) > 1 &&
      !xd->lossless[xd->mi[0]->segment_id]) {
    const int ext_tx_set =
        get_ext_tx_set(tx_size, is_inter, reduced_tx_set_used);
    if (is_inter) {
      if (ext_tx_set > 0)
        return x->mode_costs
            .inter_tx_type_costs[ext_tx_set][square_tx_size][tx_type];
    } else {
      if (ext_tx_set > 0) {
        PREDICTION_MODE intra_dir;
        if (mbmi->filter_intra_mode_info.use_filter_intra)
          intra_dir = fimode_to_intradir[mbmi->filter_intra_mode_info
                                             .filter_intra_mode];
        else
          intra_dir = mbmi->mode;
        return x->mode_costs.intra_tx_type_costs[ext_tx_set][square_tx_size]
                                                [intra_dir][tx_type];
      }
    }
  }
  return 0;
}